

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O1

Response __thiscall Response::ping(Response *this,string *connection_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  reference pvVar3;
  pointer *ppbVar4;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar5;
  Response RVar6;
  string local_70;
  value_t local_50;
  json_value local_48;
  value_t local_40;
  json_value local_38;
  undefined1 local_30 [8];
  json_value local_28;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ping","");
  Response(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                      local_70.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  local_30[0] = null;
  local_28.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[3],_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_30,(char (*) [3])"ok");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"result");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"status");
  vVar2 = pvVar3->m_type;
  pvVar3->m_type = local_30[0];
  jVar5 = pvVar3->m_value;
  (pvVar3->m_value).object = (object_t *)local_28;
  local_30[0] = vVar2;
  local_28 = jVar5;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_30 + 8),vVar2);
  local_38.object = (object_t *)0x0;
  local_40 = string;
  local_38.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,std::__cxx11::string_const&>(connection_id);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"result");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"connection_id");
  vVar2 = pvVar3->m_type;
  pvVar3->m_type = local_40;
  jVar5 = pvVar3->m_value;
  (pvVar3->m_value).object = (object_t *)local_38;
  local_40 = vVar2;
  local_38 = jVar5;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_38.boolean,vVar2);
  local_70.field_2._M_allocated_capacity._0_4_ = 0x2e352e31;
  local_70.field_2._M_allocated_capacity._4_2_ = 0x32;
  local_70._M_string_length = 5;
  local_48.object = (object_t *)0x0;
  local_50 = string;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_48.object = (object_t *)operator_new(0x20);
  ppbVar4 = &((local_48.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_48.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    *ppbVar4 = (pointer)CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                          local_70.field_2._M_allocated_capacity._0_4_));
    local_48.array[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_70.field_2._8_8_;
  }
  else {
    ((local_48.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_70._M_dataplus._M_p;
    ((local_48.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                           CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                    local_70.field_2._M_allocated_capacity._0_4_));
  }
  ((local_48.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_70._M_string_length;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity._0_4_ =
       local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"result");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"ursadb_version");
  vVar2 = pvVar3->m_type;
  pvVar3->m_type = local_50;
  jVar5 = pvVar3->m_value;
  (pvVar3->m_value).array = (array_t *)local_48;
  local_50 = vVar2;
  local_48 = jVar5;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_48.boolean,vVar2);
  jVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                      local_70.field_2._M_allocated_capacity._0_4_)) + 1);
    jVar5 = extraout_RDX_00;
  }
  RVar6.content.m_value.object = jVar5.object;
  RVar6.content._0_8_ = this;
  return (Response)RVar6.content;
}

Assistant:

Response Response::ping(const std::string &connection_id) {
    Response r("ping");
    r.content["result"]["status"] = "ok";
    r.content["result"]["connection_id"] = connection_id;
    r.content["result"]["ursadb_version"] = std::string(ursadb_version_string);
    return r;
}